

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<wasm::CastCheckTest_CastToSelfNonFinal_Test>::CreateTest
          (TestFactoryImpl<wasm::CastCheckTest_CastToSelfNonFinal_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x28);
  ::wasm::CastCheckTest_CastToSelfNonFinal_Test::CastCheckTest_CastToSelfNonFinal_Test
            ((CastCheckTest_CastToSelfNonFinal_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }